

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.cpp
# Opt level: O3

int __thiscall GenericAssemblerFile::open(GenericAssemblerFile *this,char *__file,int __oflag,...)

{
  Mode MVar1;
  char cVar2;
  bool bVar3;
  error_category *peVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  int iVar5;
  path *ppVar6;
  path *p2;
  uint7 uVar7;
  error_code errorCode;
  ofstream temp;
  error_code ec;
  string local_268;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [14];
  undefined8 local_140 [33];
  error_code local_38;
  
  uVar7 = (uint7)((ulong)__file >> 8) & 0xffffff;
  local_248._0_4_ = 0;
  peVar4 = (error_category *)std::_V2::system_category();
  this->headerSize = this->originalHeaderSize;
  this->virtualAddress = this->originalHeaderSize;
  local_248._8_8_ = peVar4;
  if ((int)__file == 0) {
    MVar1 = this->mode;
    if (MVar1 == Copy) {
      ppVar6 = &this->fileName;
      args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248;
      bVar3 = ghc::filesystem::copy_file
                        (&this->originalName,ppVar6,overwrite_existing,(error_code *)args);
      if (bVar3) {
        ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::open
                  (&this->stream,(char *)ppVar6,0x1c);
        cVar2 = std::__basic_file<char>::is_open();
        if (cVar2 != '\0') {
          return (int)CONCAT71(uVar7,1);
        }
        ghc::filesystem::path::u8string_abi_cxx11_((string *)local_238,ppVar6);
        Logger::printError<std::__cxx11::string>((Logger *)0x2,0x1895e0,(char *)local_238,args);
      }
      else {
        ghc::filesystem::path::u8string_abi_cxx11_((string *)local_238,&this->originalName);
        Logger::printError<std::__cxx11::string>((Logger *)0x2,0x1895f9,(char *)local_238,args);
      }
LAB_0013e3a0:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._0_8_ != local_228) {
        operator_delete((void *)local_238._0_8_,local_228[0]._M_allocated_capacity + 1);
      }
      return 0;
    }
    if (MVar1 == Create) {
      ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::open
                (&this->stream,(char *)&this->fileName,0x34);
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 != '\0') {
        return (int)CONCAT71(uVar7,1);
      }
      ghc::filesystem::path::u8string_abi_cxx11_((string *)local_238,&this->fileName);
      Logger::printError<std::__cxx11::string>((Logger *)0x2,0x1895e0,(char *)local_238,in_RCX);
      goto LAB_0013e3a0;
    }
    if (MVar1 == Open) {
      ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::open
                (&this->stream,(char *)&this->fileName,0x1c);
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 != '\0') {
        return (int)CONCAT71(uVar7,1);
      }
      ghc::filesystem::path::u8string_abi_cxx11_((string *)local_238,&this->fileName);
      Logger::printError<std::__cxx11::string>((Logger *)0x2,0x1895c9,(char *)local_238,in_RCX);
      goto LAB_0013e3a0;
    }
  }
  ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::basic_ofstream
            ((basic_ofstream<char,_std::char_traits<char>_> *)local_238);
  MVar1 = this->mode;
  if (MVar1 == Copy) {
    ppVar6 = &this->originalName;
    ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::open
              ((basic_ofstream<char,_std::char_traits<char>_> *)local_238,(char *)ppVar6,0x1c);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      ghc::filesystem::path::u8string_abi_cxx11_(&local_268,ppVar6);
      Logger::queueError<std::__cxx11::string>((Logger *)0x2,0x1895f9,(char *)&local_268,in_RCX);
    }
    else {
      std::ofstream::close();
      local_38._M_value = 0;
      p2 = &this->fileName;
      local_38._M_cat = peVar4;
      bVar3 = ghc::filesystem::equivalent(ppVar6,p2,&local_38);
      if (bVar3) {
        ghc::filesystem::path::u8string_abi_cxx11_(&local_268,ppVar6);
        Logger::queueError<std::__cxx11::string>((Logger *)0x2,0x1895f9,(char *)&local_268,in_RCX);
      }
      else {
        bVar3 = ghc::filesystem::exists(p2);
        iVar5 = 0x34;
        if (bVar3) {
          iVar5 = 0x1c;
        }
        ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::open
                  ((basic_ofstream<char,_std::char_traits<char>_> *)local_238,(char *)p2,iVar5);
        cVar2 = std::__basic_file<char>::is_open();
        if (cVar2 != '\0') {
          std::ofstream::close();
          goto LAB_0013e147;
        }
        ghc::filesystem::path::u8string_abi_cxx11_(&local_268,p2);
        Logger::queueError<std::__cxx11::string>((Logger *)0x2,0x1895e0,(char *)&local_268,in_RCX);
      }
    }
LAB_0013e32b:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (MVar1 == Create) {
      ppVar6 = &this->fileName;
      bVar3 = ghc::filesystem::exists(ppVar6);
      iVar5 = 0x34;
      if (bVar3) {
        iVar5 = 0x1c;
      }
      ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::open
                ((basic_ofstream<char,_std::char_traits<char>_> *)local_238,(char *)ppVar6,iVar5);
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 != '\0') {
        std::ofstream::close();
LAB_0013e147:
        iVar5 = (int)CONCAT71(uVar7,1);
        if (bVar3 == false) {
          ghc::filesystem::remove((filesystem *)&this->fileName,local_248);
        }
        goto LAB_0013e348;
      }
      ghc::filesystem::path::u8string_abi_cxx11_(&local_268,ppVar6);
      Logger::queueError<std::__cxx11::string>((Logger *)0x2,0x1895e0,(char *)&local_268,in_RCX);
      goto LAB_0013e32b;
    }
    if (MVar1 == Open) {
      ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::open
                ((basic_ofstream<char,_std::char_traits<char>_> *)local_238,(char *)&this->fileName,
                 0x1c);
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 != '\0') {
        iVar5 = (int)CONCAT71(uVar7,1);
        std::ofstream::close();
        goto LAB_0013e348;
      }
      ghc::filesystem::path::u8string_abi_cxx11_(&local_268,&this->fileName);
      Logger::queueError<std::__cxx11::string>((Logger *)0x2,0x1895c9,(char *)&local_268,in_RCX);
      goto LAB_0013e32b;
    }
  }
  iVar5 = 0;
LAB_0013e348:
  local_238._0_8_ =
       (long)std::ofstream-in-ghc::filesystem::basic_ofstream<char,std::char_traits<char>>::
             construction_vtable + 0x18;
  local_140[0] = 0x1bc820;
  std::filebuf::~filebuf((filebuf *)(local_238 + 8));
  std::ios_base::~ios_base((ios_base *)local_140);
  return iVar5;
}

Assistant:

bool GenericAssemblerFile::open(bool onlyCheck)
{
	std::error_code errorCode;

	headerSize = originalHeaderSize;
	virtualAddress = headerSize;

	auto flagsOpenExisting = fs::ofstream::in | fs::ofstream::out | fs::ofstream::binary;
	auto flagsOverwrite = fs::ofstream::out | fs::ofstream::trunc | fs::ofstream::binary;

	if (!onlyCheck)
	{
		// actually open the file
		switch (mode)
		{
		case Open:
			stream.open(fileName, flagsOpenExisting);
			if (!stream.is_open())
			{
				Logger::printError(Logger::FatalError, "Could not open file %s",fileName.u8string());
				return false;
			}
			return true;

		case Create:
			stream.open(fileName, flagsOverwrite);
			if (!stream.is_open())
			{
				Logger::printError(Logger::FatalError, "Could not create file %s",fileName.u8string());
				return false;
			}
			return true;

		case Copy:
			if (!fs::copy_file(originalName, fileName, fs::copy_options::overwrite_existing, errorCode))
			{
				Logger::printError(Logger::FatalError, "Could not copy file %s",originalName.u8string());
				return false;
			}

			stream.open(fileName, flagsOpenExisting);
			if (!stream.is_open())
			{
				Logger::printError(Logger::FatalError, "Could not create file %s",fileName.u8string());
				return false;
			}
			return true;
		}
	}

	// else only check if it can be done, don't actually do it permanently
	bool exists = false;
	fs::ofstream temp;
	switch (mode)
	{
	case Open:
		temp.open(fileName, flagsOpenExisting);
		if (!temp.is_open())
		{
			Logger::queueError(Logger::FatalError, "Could not open file %s",fileName.u8string());
			return false;
		}
		temp.close();
		return true;

	case Create:
		// open file with writee access. if it didn't exist before, remove it afterwards
		exists = fs::exists(fileName);

		temp.open(fileName, exists ? flagsOpenExisting : flagsOverwrite);
		if (!temp.is_open())
		{
			Logger::queueError(Logger::FatalError, "Could not create file %s",fileName.u8string());
			return false;
		}
		temp.close();

		if (!exists)
			fs::remove(fileName, errorCode);

		return true;

	case Copy:
		// check original file
		temp.open(originalName, flagsOpenExisting);
		if (!temp.is_open())
		{
			Logger::queueError(Logger::FatalError, "Could not copy file %s",originalName.u8string());
			return false;
		}
		temp.close();

		// Check input and output are not the same
		std::error_code ec;
		if (fs::equivalent(originalName, fileName, ec))
		{
			Logger::queueError(Logger::FatalError, "Could not copy file %s", originalName.u8string());
			return false;
		}

		// check new file, same as create
		exists = fs::exists(fileName);

		temp.open(fileName, exists ? flagsOpenExisting : flagsOverwrite);
		if (!temp.is_open())
		{
			Logger::queueError(Logger::FatalError, "Could not create file %s",fileName.u8string());
			return false;
		}
		temp.close();

		if (!exists)
			fs::remove(fileName, errorCode);
		return true;
	}

	return false;
}